

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat>,_false>
__thiscall
duckdb::make_unsafe_uniq_array_uninitialized<duckdb::UnifiedVectorFormat>(duckdb *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  long lVar5;
  UnifiedVectorFormat *this_00;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0x48),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x48),8) == 0) {
    uVar2 = uVar3;
  }
  psVar4 = (size_t *)operator_new__(uVar2);
  *psVar4 = n;
  if (n != 0) {
    lVar5 = 0;
    this_00 = (UnifiedVectorFormat *)(psVar4 + 1);
    do {
      UnifiedVectorFormat::UnifiedVectorFormat(this_00);
      lVar5 = lVar5 + -0x48;
      this_00 = this_00 + 1;
    } while (n * -0x48 - lVar5 != 0);
  }
  *(UnifiedVectorFormat **)this = (UnifiedVectorFormat *)(psVar4 + 1);
  return (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
          )(unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
            )this;
}

Assistant:

inline unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>
make_unsafe_uniq_array_uninitialized(size_t n) // NOLINT: mimic std style
{
	return unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>(new DATA_TYPE[n]);
}